

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  long lVar10;
  undefined4 uVar11;
  long lVar12;
  bool bVar13;
  ulong uVar14;
  int unaff_EBP;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  vfloat4 a0;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar47;
  float fVar48;
  float fVar74;
  Vec3fa n0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar104;
  float fVar113;
  float fVar114;
  Vec3ff v3;
  float fVar115;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar112;
  float fVar116;
  float fVar117;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  Vec3fa n1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar138;
  vfloat4 a_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar145;
  float fVar147;
  undefined1 auVar141 [16];
  float fVar140;
  float fVar146;
  float fVar148;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar149;
  uint uVar150;
  float fVar153;
  uint uVar154;
  float fVar155;
  uint uVar156;
  uint uVar157;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar172;
  float fVar173;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar180;
  float fVar181;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  uint uVar202;
  uint uVar205;
  uint uVar206;
  uint uVar207;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_1c8 [16];
  size_t local_e0;
  size_t local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar17 = r->_begin;
  if (uVar17 < r->_end) {
    local_e0 = 0;
    local_c8 = _DAT_01f7a9f0;
    local_b8 = _DAT_01f7aa00;
    local_98 = _DAT_01f7a9f0;
    local_a8 = _DAT_01f7aa00;
    local_d0 = k;
    do {
      pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      uVar150 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar17);
      uVar14 = (ulong)uVar150;
      uVar18 = (ulong)(uVar150 + 3);
      if (uVar18 < (pBVar5->super_RawBufferView).num) {
        uVar19 = (ulong)(uVar150 + 1);
        uVar20 = (ulong)(uVar150 + 2);
        pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        fVar104 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .maxRadiusScale;
        uVar16 = 0;
        do {
          pcVar7 = pBVar5[uVar16].super_RawBufferView.ptr_ofs;
          sVar8 = pBVar5[uVar16].super_RawBufferView.stride;
          lVar12 = sVar8 * uVar14;
          lVar10 = sVar8 * uVar19;
          auVar49._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar10 + 0xc)));
          auVar49._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar12 + 0xc)));
          auVar49._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + sVar8 * uVar20 + 0xc)));
          auVar49._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + sVar8 * uVar18 + 0xc)));
          unaff_EBP = movmskps(unaff_EBP,auVar49);
          if (unaff_EBP != 0) goto LAB_009da0b0;
          auVar49 = *(undefined1 (*) [16])(pcVar7 + lVar12);
          fVar172 = auVar49._0_4_;
          fVar177 = auVar49._4_4_;
          fVar178 = auVar49._8_4_;
          fVar179 = auVar49._12_4_;
          auVar141._0_4_ = -(uint)(fVar172 < 1.844e+18 && -1.844e+18 < fVar172);
          auVar141._4_4_ = -(uint)(fVar177 < 1.844e+18 && -1.844e+18 < fVar177);
          auVar141._8_4_ = -(uint)(fVar178 < 1.844e+18 && -1.844e+18 < fVar178);
          auVar141._12_4_ = -(uint)(fVar179 < 1.844e+18 && -1.844e+18 < fVar179);
          uVar11 = movmskps((int)lVar12,auVar141);
          if ((~(byte)uVar11 & 7) != 0) goto LAB_009da0b0;
          auVar49 = *(undefined1 (*) [16])(pcVar7 + lVar10);
          fVar75 = auVar49._0_4_;
          fVar90 = auVar49._4_4_;
          fVar91 = auVar49._8_4_;
          fVar92 = auVar49._12_4_;
          auVar22._0_4_ = -(uint)(fVar75 < 1.844e+18 && -1.844e+18 < fVar75);
          auVar22._4_4_ = -(uint)(fVar90 < 1.844e+18 && -1.844e+18 < fVar90);
          auVar22._8_4_ = -(uint)(fVar91 < 1.844e+18 && -1.844e+18 < fVar91);
          auVar22._12_4_ = -(uint)(fVar92 < 1.844e+18 && -1.844e+18 < fVar92);
          uVar11 = movmskps((int)lVar10,auVar22);
          if ((~(byte)uVar11 & 7) != 0) goto LAB_009da0b0;
          auVar49 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar20);
          fVar93 = auVar49._0_4_;
          fVar100 = auVar49._4_4_;
          fVar101 = auVar49._8_4_;
          fVar102 = auVar49._12_4_;
          auVar133._0_4_ = -(uint)(fVar93 < 1.844e+18 && -1.844e+18 < fVar93);
          auVar133._4_4_ = -(uint)(fVar100 < 1.844e+18 && -1.844e+18 < fVar100);
          auVar133._8_4_ = -(uint)(fVar101 < 1.844e+18 && -1.844e+18 < fVar101);
          auVar133._12_4_ = -(uint)(fVar102 < 1.844e+18 && -1.844e+18 < fVar102);
          uVar11 = movmskps(CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11),auVar133);
          if ((~(byte)uVar11 & 7) != 0) goto LAB_009da0b0;
          auVar49 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar18);
          fVar103 = auVar49._0_4_;
          fVar113 = auVar49._4_4_;
          fVar114 = auVar49._8_4_;
          fVar115 = auVar49._12_4_;
          auVar50._0_4_ = -(uint)(fVar103 < 1.844e+18 && -1.844e+18 < fVar103);
          auVar50._4_4_ = -(uint)(fVar113 < 1.844e+18 && -1.844e+18 < fVar113);
          auVar50._8_4_ = -(uint)(fVar114 < 1.844e+18 && -1.844e+18 < fVar114);
          auVar50._12_4_ = -(uint)(fVar115 < 1.844e+18 && -1.844e+18 < fVar115);
          uVar11 = movmskps(CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11),auVar50);
          if ((~(byte)uVar11 & 7) != 0) goto LAB_009da0b0;
          pcVar7 = pBVar6[uVar16].super_RawBufferView.ptr_ofs;
          sVar8 = pBVar6[uVar16].super_RawBufferView.stride;
          auVar49 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar14);
          fVar48 = auVar49._0_4_;
          fVar74 = auVar49._4_4_;
          fVar130 = auVar49._8_4_;
          auVar159._0_4_ = -(uint)(fVar48 < 1.844e+18 && -1.844e+18 < fVar48);
          auVar159._4_4_ = -(uint)(fVar74 < 1.844e+18 && -1.844e+18 < fVar74);
          auVar159._8_4_ = -(uint)(fVar130 < 1.844e+18 && -1.844e+18 < fVar130);
          auVar159._12_4_ = -(uint)(auVar49._12_4_ < 1.844e+18 && -1.844e+18 < auVar49._12_4_);
          uVar11 = movmskps((int)(sVar8 * uVar14),auVar159);
          if ((~(byte)uVar11 & 7) != 0) goto LAB_009da0b0;
          auVar49 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar19);
          fVar116 = auVar49._0_4_;
          fVar127 = auVar49._4_4_;
          fVar129 = auVar49._8_4_;
          auVar118._0_4_ = -(uint)(fVar116 < 1.844e+18 && -1.844e+18 < fVar116);
          auVar118._4_4_ = -(uint)(fVar127 < 1.844e+18 && -1.844e+18 < fVar127);
          auVar118._8_4_ = -(uint)(fVar129 < 1.844e+18 && -1.844e+18 < fVar129);
          auVar118._12_4_ = -(uint)(auVar49._12_4_ < 1.844e+18 && -1.844e+18 < auVar49._12_4_);
          uVar11 = movmskps((int)(sVar8 * uVar19),auVar118);
          if ((~(byte)uVar11 & 7) != 0) goto LAB_009da0b0;
          fVar179 = fVar179 * fVar104;
          fVar92 = fVar92 * fVar104;
          fVar102 = fVar102 * fVar104;
          fVar115 = fVar115 * fVar104;
          pfVar1 = (float *)(pcVar7 + sVar8 * uVar20);
          fVar137 = *pfVar1;
          fVar138 = pfVar1[1];
          fVar140 = pfVar1[2];
          pfVar1 = (float *)(pcVar7 + sVar8 * uVar18);
          fVar158 = *pfVar1;
          fVar146 = pfVar1[1];
          fVar148 = pfVar1[2];
          fVar180 = (fVar93 * 0.5 + fVar103 * 0.0 + fVar75 * 0.0) - fVar172 * 0.5;
          fVar184 = (fVar100 * 0.5 + fVar113 * 0.0 + fVar90 * 0.0) - fVar177 * 0.5;
          fVar186 = (fVar101 * 0.5 + fVar114 * 0.0 + fVar91 * 0.0) - fVar178 * 0.5;
          fVar188 = (fVar102 * 0.5 + fVar115 * 0.0 + fVar92 * 0.0) - fVar179 * 0.5;
          fVar139 = (fVar137 * 0.5 + fVar158 * 0.0 + fVar116 * 0.0) - fVar48 * 0.5;
          fVar145 = (fVar138 * 0.5 + fVar146 * 0.0 + fVar127 * 0.0) - fVar74 * 0.5;
          fVar147 = (fVar140 * 0.5 + fVar148 * 0.0 + fVar129 * 0.0) - fVar130 * 0.5;
          fVar190 = fVar93 * 0.0 + fVar103 * -0.0 + fVar75 + fVar172 * -0.0;
          fVar193 = fVar100 * 0.0 + fVar113 * -0.0 + fVar90 + fVar177 * -0.0;
          fVar196 = fVar101 * 0.0 + fVar114 * -0.0 + fVar91 + fVar178 * -0.0;
          fVar199 = fVar102 * 0.0 + fVar115 * -0.0 + fVar92 + fVar179 * -0.0;
          fVar149 = fVar137 * 0.0 + fVar158 * -0.0 + fVar116 + fVar48 * -0.0;
          fVar153 = fVar138 * 0.0 + fVar146 * -0.0 + fVar127 + fVar74 * -0.0;
          fVar155 = fVar140 * 0.0 + fVar148 * -0.0 + fVar129 + fVar130 * -0.0;
          fVar191 = fVar103 * -0.0 + fVar93 + fVar75 * 0.0 + fVar172 * -0.0;
          fVar194 = fVar113 * -0.0 + fVar100 + fVar90 * 0.0 + fVar177 * -0.0;
          fVar197 = fVar114 * -0.0 + fVar101 + fVar91 * 0.0 + fVar178 * -0.0;
          fVar200 = fVar115 * -0.0 + fVar102 + fVar92 * 0.0 + fVar179 * -0.0;
          fVar192 = fVar172 * 0.0 + ((fVar103 * 0.5 + fVar93 * 0.0) - fVar75 * 0.5);
          fVar195 = fVar177 * 0.0 + ((fVar113 * 0.5 + fVar100 * 0.0) - fVar90 * 0.5);
          fVar198 = fVar178 * 0.0 + ((fVar114 * 0.5 + fVar101 * 0.0) - fVar91 * 0.5);
          fVar201 = fVar179 * 0.0 + ((fVar115 * 0.5 + fVar102 * 0.0) - fVar92 * 0.5);
          fVar178 = fVar158 * -0.0 + fVar137 + fVar116 * 0.0 + fVar48 * -0.0;
          fVar92 = fVar146 * -0.0 + fVar138 + fVar127 * 0.0 + fVar74 * -0.0;
          fVar75 = fVar148 * -0.0 + fVar140 + fVar129 * 0.0 + fVar130 * -0.0;
          fVar179 = fVar48 * 0.0 + ((fVar158 * 0.5 + fVar137 * 0.0) - fVar116 * 0.5);
          fVar172 = fVar74 * 0.0 + ((fVar146 * 0.5 + fVar138 * 0.0) - fVar127 * 0.5);
          fVar177 = fVar130 * 0.0 + ((fVar148 * 0.5 + fVar140 * 0.0) - fVar129 * 0.5);
          fVar127 = fVar149 * fVar184 - fVar153 * fVar180;
          fVar74 = fVar153 * fVar186 - fVar155 * fVar184;
          fVar116 = fVar155 * fVar180 - fVar149 * fVar186;
          fVar91 = fVar184 * fVar139 - fVar145 * fVar180;
          fVar102 = fVar186 * fVar145 - fVar147 * fVar184;
          fVar93 = fVar180 * fVar147 - fVar139 * fVar186;
          fVar100 = fVar178 * fVar195 - fVar92 * fVar192;
          fVar103 = fVar92 * fVar198 - fVar75 * fVar195;
          fVar114 = fVar75 * fVar192 - fVar178 * fVar198;
          fVar178 = fVar195 * fVar179 - fVar172 * fVar192;
          fVar75 = fVar198 * fVar172 - fVar177 * fVar195;
          fVar90 = fVar192 * fVar177 - fVar179 * fVar198;
          fVar172 = fVar116 * fVar116 + fVar74 * fVar74 + fVar127 * fVar127;
          auVar141 = ZEXT416((uint)fVar172);
          auVar49 = rsqrtss(ZEXT416((uint)fVar172),auVar141);
          fVar179 = auVar49._0_4_;
          fVar177 = fVar179 * 1.5 - fVar179 * fVar179 * fVar172 * 0.5 * fVar179;
          fVar158 = fVar127 * fVar91 + fVar116 * fVar93 + fVar74 * fVar102;
          auVar49 = rcpss(auVar141,auVar141);
          fVar179 = (2.0 - fVar172 * auVar49._0_4_) * auVar49._0_4_;
          fVar48 = fVar114 * fVar114 + fVar103 * fVar103 + fVar100 * fVar100;
          auVar49 = ZEXT416((uint)fVar48);
          auVar141 = rsqrtss(ZEXT416((uint)fVar48),auVar49);
          fVar92 = auVar141._0_4_;
          fVar101 = fVar92 * 1.5 - fVar92 * fVar92 * fVar48 * 0.5 * fVar92;
          fVar140 = fVar100 * fVar178 + fVar114 * fVar90 + fVar103 * fVar75;
          auVar49 = rcpss(auVar49,auVar49);
          fVar92 = (2.0 - fVar48 * auVar49._0_4_) * auVar49._0_4_;
          fVar115 = fVar199 * fVar74 * fVar177;
          fVar113 = fVar199 * fVar116 * fVar177;
          fVar130 = fVar199 * fVar127 * fVar177;
          fVar129 = fVar190 - fVar115;
          fVar137 = fVar193 - fVar113;
          fVar138 = fVar196 - fVar130;
          fVar74 = fVar199 * fVar179 * (fVar172 * fVar102 - fVar158 * fVar74) * fVar177 +
                   fVar188 * fVar74 * fVar177;
          fVar116 = fVar199 * fVar179 * (fVar172 * fVar93 - fVar158 * fVar116) * fVar177 +
                    fVar188 * fVar116 * fVar177;
          fVar127 = fVar199 * fVar179 * (fVar172 * fVar91 - fVar158 * fVar127) * fVar177 +
                    fVar188 * fVar127 * fVar177;
          fVar179 = fVar200 * fVar103 * fVar101;
          fVar172 = fVar200 * fVar114 * fVar101;
          fVar177 = fVar200 * fVar100 * fVar101;
          fVar158 = fVar191 - fVar179;
          fVar146 = fVar194 - fVar172;
          fVar148 = fVar197 - fVar177;
          fVar91 = fVar200 * fVar92 * (fVar48 * fVar75 - fVar140 * fVar103) * fVar101 +
                   fVar201 * fVar103 * fVar101;
          fVar90 = fVar200 * fVar92 * (fVar48 * fVar90 - fVar140 * fVar114) * fVar101 +
                   fVar201 * fVar114 * fVar101;
          fVar102 = fVar200 * fVar92 * (fVar48 * fVar178 - fVar140 * fVar100) * fVar101 +
                    fVar201 * fVar100 * fVar101;
          fVar93 = (fVar180 - fVar74) * 0.33333334 + fVar129;
          fVar100 = (fVar184 - fVar116) * 0.33333334 + fVar137;
          fVar101 = (fVar186 - fVar127) * 0.33333334 + fVar138;
          fVar178 = fVar158 - (fVar192 - fVar91) * 0.33333334;
          fVar92 = fVar146 - (fVar195 - fVar90) * 0.33333334;
          fVar75 = fVar148 - (fVar198 - fVar102) * 0.33333334;
          lVar10 = 0;
          auVar49 = _DAT_01f7a9f0;
          auVar141 = _DAT_01f7a9f0;
          auVar22 = _DAT_01f7aa00;
          auVar133 = _DAT_01f7aa00;
          auVar50 = _DAT_01f7aa00;
          auVar159 = _DAT_01f7a9f0;
          bVar21 = true;
          do {
            bVar13 = bVar21;
            iVar15 = (int)lVar10;
            lVar12 = lVar10 * 4;
            fVar103 = *(float *)(bezier_basis0 + lVar12 + 0x1dc);
            fVar114 = *(float *)(bezier_basis0 + lVar12 + 0x1e0);
            fVar48 = *(float *)(bezier_basis0 + lVar12 + 0x1e4);
            fVar140 = *(float *)(bezier_basis0 + lVar12 + 0x1e8);
            lVar12 = lVar10 * 4;
            fVar139 = *(float *)(bezier_basis0 + lVar12 + 0x660);
            fVar145 = *(float *)(bezier_basis0 + lVar12 + 0x664);
            fVar147 = *(float *)(bezier_basis0 + lVar12 + 0x668);
            fVar149 = *(float *)(bezier_basis0 + lVar12 + 0x66c);
            lVar12 = lVar10 * 4;
            fVar153 = *(float *)(bezier_basis0 + lVar12 + 0xae4);
            fVar155 = *(float *)(bezier_basis0 + lVar12 + 0xae8);
            fVar188 = *(float *)(bezier_basis0 + lVar12 + 0xaec);
            fVar199 = *(float *)(bezier_basis0 + lVar12 + 0xaf0);
            lVar12 = lVar10 * 4;
            fVar200 = *(float *)(bezier_basis0 + lVar12 + 0xf68);
            fVar201 = *(float *)(bezier_basis0 + lVar12 + 0xf6c);
            fVar9 = *(float *)(bezier_basis0 + lVar12 + 0xf70);
            fVar173 = *(float *)(bezier_basis0 + lVar12 + 0xf74);
            auVar164._0_4_ =
                 fVar129 * fVar103 + fVar93 * fVar139 + fVar178 * fVar153 + fVar158 * fVar200;
            auVar164._4_4_ =
                 fVar129 * fVar114 + fVar93 * fVar145 + fVar178 * fVar155 + fVar158 * fVar201;
            auVar164._8_4_ =
                 fVar129 * fVar48 + fVar93 * fVar147 + fVar178 * fVar188 + fVar158 * fVar9;
            auVar164._12_4_ =
                 fVar129 * fVar140 + fVar93 * fVar149 + fVar178 * fVar199 + fVar158 * fVar173;
            auVar174._0_4_ =
                 fVar137 * fVar103 + fVar100 * fVar139 + fVar92 * fVar153 + fVar146 * fVar200;
            auVar174._4_4_ =
                 fVar137 * fVar114 + fVar100 * fVar145 + fVar92 * fVar155 + fVar146 * fVar201;
            auVar174._8_4_ =
                 fVar137 * fVar48 + fVar100 * fVar147 + fVar92 * fVar188 + fVar146 * fVar9;
            auVar174._12_4_ =
                 fVar137 * fVar140 + fVar100 * fVar149 + fVar92 * fVar199 + fVar146 * fVar173;
            auVar94._0_4_ =
                 fVar103 * fVar138 + fVar139 * fVar101 + fVar153 * fVar75 + fVar200 * fVar148;
            auVar94._4_4_ =
                 fVar114 * fVar138 + fVar145 * fVar101 + fVar155 * fVar75 + fVar201 * fVar148;
            auVar94._8_4_ =
                 fVar48 * fVar138 + fVar147 * fVar101 + fVar188 * fVar75 + fVar9 * fVar148;
            auVar94._12_4_ =
                 fVar140 * fVar138 + fVar149 * fVar101 + fVar199 * fVar75 + fVar173 * fVar148;
            lVar12 = lVar10 * 4;
            fVar103 = *(float *)(bezier_basis0 + lVar12 + 0x13ec);
            fVar114 = *(float *)(bezier_basis0 + lVar12 + 0x13f0);
            fVar48 = *(float *)(bezier_basis0 + lVar12 + 0x13f4);
            fVar140 = *(float *)(bezier_basis0 + lVar12 + 0x13f8);
            lVar12 = lVar10 * 4;
            fVar139 = *(float *)(bezier_basis0 + lVar12 + 0x1cf4);
            fVar145 = *(float *)(bezier_basis0 + lVar12 + 0x1cf8);
            fVar147 = *(float *)(bezier_basis0 + lVar12 + 0x1cfc);
            fVar149 = *(float *)(bezier_basis0 + lVar12 + 0x1d00);
            lVar12 = lVar10 * 4;
            fVar153 = *(float *)(bezier_basis0 + lVar12 + 0x2178);
            fVar155 = *(float *)(bezier_basis0 + lVar12 + 0x217c);
            fVar188 = *(float *)(bezier_basis0 + lVar12 + 0x2180);
            fVar199 = *(float *)(bezier_basis0 + lVar12 + 0x2184);
            lVar10 = lVar10 * 4;
            fVar200 = *(float *)(bezier_basis0 + lVar10 + 0x1870);
            fVar201 = *(float *)(bezier_basis0 + lVar10 + 0x1874);
            fVar9 = *(float *)(bezier_basis0 + lVar10 + 0x1878);
            fVar173 = *(float *)(bezier_basis0 + lVar10 + 0x187c);
            fVar117 = fVar129 * fVar103 + fVar93 * fVar200 + fVar178 * fVar139 + fVar158 * fVar153;
            fVar128 = fVar129 * fVar114 + fVar93 * fVar201 + fVar178 * fVar145 + fVar158 * fVar155;
            fVar131 = fVar129 * fVar48 + fVar93 * fVar9 + fVar178 * fVar147 + fVar158 * fVar188;
            fVar132 = fVar129 * fVar140 + fVar93 * fVar173 + fVar178 * fVar149 + fVar158 * fVar199;
            fVar181 = fVar137 * fVar103 + fVar100 * fVar200 + fVar92 * fVar139 + fVar146 * fVar153;
            fVar185 = fVar137 * fVar114 + fVar100 * fVar201 + fVar92 * fVar145 + fVar146 * fVar155;
            fVar187 = fVar137 * fVar48 + fVar100 * fVar9 + fVar92 * fVar147 + fVar146 * fVar188;
            fVar189 = fVar137 * fVar140 + fVar100 * fVar173 + fVar92 * fVar149 + fVar146 * fVar199;
            fVar103 = fVar103 * fVar138 + fVar200 * fVar101 + fVar139 * fVar75 + fVar153 * fVar148;
            fVar114 = fVar114 * fVar138 + fVar201 * fVar101 + fVar145 * fVar75 + fVar155 * fVar148;
            fVar48 = fVar48 * fVar138 + fVar9 * fVar101 + fVar147 * fVar75 + fVar188 * fVar148;
            fVar140 = fVar140 * fVar138 + fVar173 * fVar101 + fVar149 * fVar75 + fVar199 * fVar148;
            uVar150 = -(uint)(iVar15 == 0);
            uVar154 = -(uint)(iVar15 == 1);
            uVar156 = -(uint)(iVar15 == 2);
            uVar157 = -(uint)(iVar15 == 3);
            uVar202 = -(uint)(iVar15 == 7);
            uVar205 = -(uint)(iVar15 == 6);
            uVar206 = -(uint)(iVar15 == 5);
            uVar207 = -(uint)(iVar15 == 4);
            auVar105._0_4_ = (float)(~uVar202 & (uint)fVar117) * 0.055555556 + auVar164._0_4_;
            auVar105._4_4_ = (float)(~uVar205 & (uint)fVar128) * 0.055555556 + auVar164._4_4_;
            auVar105._8_4_ = (float)(~uVar206 & (uint)fVar131) * 0.055555556 + auVar164._8_4_;
            auVar105._12_4_ = (float)(~uVar207 & (uint)fVar132) * 0.055555556 + auVar164._12_4_;
            auVar141 = minps(auVar141,auVar164);
            auVar135 = maxps(auVar50,auVar164);
            auVar165._0_8_ =
                 CONCAT44(auVar164._4_4_ - (float)(~uVar154 & (uint)fVar128) * 0.055555556,
                          auVar164._0_4_ - (float)(~uVar150 & (uint)fVar117) * 0.055555556);
            auVar165._8_4_ = auVar164._8_4_ - (float)(~uVar156 & (uint)fVar131) * 0.055555556;
            auVar165._12_4_ = auVar164._12_4_ - (float)(~uVar157 & (uint)fVar132) * 0.055555556;
            auVar142._0_4_ = (float)(~uVar202 & (uint)fVar181) * 0.055555556 + auVar174._0_4_;
            auVar142._4_4_ = (float)(~uVar205 & (uint)fVar185) * 0.055555556 + auVar174._4_4_;
            auVar142._8_4_ = (float)(~uVar206 & (uint)fVar187) * 0.055555556 + auVar174._8_4_;
            auVar142._12_4_ = (float)(~uVar207 & (uint)fVar189) * 0.055555556 + auVar174._12_4_;
            auVar50 = minps(auVar49,auVar174);
            auVar133 = maxps(auVar133,auVar174);
            auVar175._0_8_ =
                 CONCAT44(auVar174._4_4_ - (float)(~uVar154 & (uint)fVar185) * 0.055555556,
                          auVar174._0_4_ - (float)(~uVar150 & (uint)fVar181) * 0.055555556);
            auVar175._8_4_ = auVar174._8_4_ - (float)(~uVar156 & (uint)fVar187) * 0.055555556;
            auVar175._12_4_ = auVar174._12_4_ - (float)(~uVar157 & (uint)fVar189) * 0.055555556;
            auVar203._0_4_ = (float)(~uVar202 & (uint)fVar103) * 0.055555556 + auVar94._0_4_;
            auVar203._4_4_ = (float)(~uVar205 & (uint)fVar114) * 0.055555556 + auVar94._4_4_;
            auVar203._8_4_ = (float)(~uVar206 & (uint)fVar48) * 0.055555556 + auVar94._8_4_;
            auVar203._12_4_ = (float)(~uVar207 & (uint)fVar140) * 0.055555556 + auVar94._12_4_;
            auVar159 = minps(auVar159,auVar94);
            auVar118 = maxps(auVar22,auVar94);
            auVar95._0_8_ =
                 CONCAT44(auVar94._4_4_ - (float)(~uVar154 & (uint)fVar114) * 0.055555556,
                          auVar94._0_4_ - (float)(~uVar150 & (uint)fVar103) * 0.055555556);
            auVar95._8_4_ = auVar94._8_4_ - (float)(~uVar156 & (uint)fVar48) * 0.055555556;
            auVar95._12_4_ = auVar94._12_4_ - (float)(~uVar157 & (uint)fVar140) * 0.055555556;
            auVar134._8_4_ = auVar165._8_4_;
            auVar134._0_8_ = auVar165._0_8_;
            auVar134._12_4_ = auVar165._12_4_;
            auVar49 = minps(auVar134,auVar105);
            auVar141 = minps(auVar141,auVar49);
            auVar143._8_4_ = auVar175._8_4_;
            auVar143._0_8_ = auVar175._0_8_;
            auVar143._12_4_ = auVar175._12_4_;
            auVar49 = minps(auVar143,auVar142);
            auVar49 = minps(auVar50,auVar49);
            auVar176._8_4_ = auVar95._8_4_;
            auVar176._0_8_ = auVar95._0_8_;
            auVar176._12_4_ = auVar95._12_4_;
            auVar22 = minps(auVar176,auVar203);
            auVar159 = minps(auVar159,auVar22);
            auVar22 = maxps(auVar165,auVar105);
            auVar50 = maxps(auVar135,auVar22);
            auVar22 = maxps(auVar175,auVar142);
            auVar133 = maxps(auVar133,auVar22);
            auVar22 = maxps(auVar95,auVar203);
            auVar22 = maxps(auVar118,auVar22);
            lVar10 = 4;
            bVar21 = false;
          } while (bVar13);
          fVar190 = fVar190 + fVar115;
          fVar193 = fVar193 + fVar113;
          fVar196 = fVar196 + fVar130;
          fVar191 = fVar191 + fVar179;
          fVar194 = fVar194 + fVar172;
          fVar197 = fVar197 + fVar177;
          fVar178 = (fVar74 + fVar180) * 0.33333334 + fVar190;
          fVar92 = (fVar116 + fVar184) * 0.33333334 + fVar193;
          fVar75 = (fVar127 + fVar186) * 0.33333334 + fVar196;
          fVar179 = fVar191 - (fVar91 + fVar192) * 0.33333334;
          fVar172 = fVar194 - (fVar90 + fVar195) * 0.33333334;
          fVar177 = fVar197 - (fVar102 + fVar198) * 0.33333334;
          auVar135._4_4_ = auVar141._0_4_;
          auVar135._0_4_ = auVar141._4_4_;
          auVar135._8_4_ = auVar141._12_4_;
          auVar135._12_4_ = auVar141._8_4_;
          auVar141 = minps(auVar135,auVar141);
          auVar76._0_8_ = auVar141._8_8_;
          auVar76._8_4_ = auVar141._0_4_;
          auVar76._12_4_ = auVar141._4_4_;
          auVar141 = minps(auVar76,auVar141);
          auVar23._4_4_ = auVar49._0_4_;
          auVar23._0_4_ = auVar49._4_4_;
          auVar23._8_4_ = auVar49._12_4_;
          auVar23._12_4_ = auVar49._8_4_;
          auVar49 = minps(auVar23,auVar49);
          auVar51._0_8_ = auVar49._8_8_;
          auVar51._8_4_ = auVar49._0_4_;
          auVar51._12_4_ = auVar49._4_4_;
          auVar49 = minps(auVar51,auVar49);
          auVar24._4_4_ = auVar159._0_4_;
          auVar24._0_4_ = auVar159._4_4_;
          auVar24._8_4_ = auVar159._12_4_;
          auVar24._12_4_ = auVar159._8_4_;
          auVar159 = minps(auVar24,auVar159);
          auVar25._0_8_ = auVar159._8_8_;
          auVar25._8_4_ = auVar159._0_4_;
          auVar25._12_4_ = auVar159._4_4_;
          auVar109._4_4_ = auVar49._0_4_;
          auVar109._0_4_ = auVar141._0_4_;
          auVar26._4_4_ = auVar50._0_4_;
          auVar26._0_4_ = auVar50._4_4_;
          auVar26._8_4_ = auVar50._12_4_;
          auVar26._12_4_ = auVar50._8_4_;
          auVar49 = maxps(auVar26,auVar50);
          auVar52._0_8_ = auVar49._8_8_;
          auVar52._8_4_ = auVar49._0_4_;
          auVar52._12_4_ = auVar49._4_4_;
          auVar141 = maxps(auVar52,auVar49);
          auVar27._4_4_ = auVar133._0_4_;
          auVar27._0_4_ = auVar133._4_4_;
          auVar27._8_4_ = auVar133._12_4_;
          auVar27._12_4_ = auVar133._8_4_;
          auVar49 = maxps(auVar27,auVar133);
          auVar77._0_8_ = auVar49._8_8_;
          auVar77._8_4_ = auVar49._0_4_;
          auVar77._12_4_ = auVar49._4_4_;
          auVar49 = maxps(auVar77,auVar49);
          auVar28._4_4_ = auVar22._0_4_;
          auVar28._0_4_ = auVar22._4_4_;
          auVar28._8_4_ = auVar22._12_4_;
          auVar28._12_4_ = auVar22._8_4_;
          auVar50 = maxps(auVar28,auVar22);
          auVar29._0_8_ = auVar50._8_8_;
          auVar29._8_4_ = auVar50._0_4_;
          auVar29._12_4_ = auVar50._4_4_;
          auVar121._4_4_ = auVar49._0_4_;
          auVar121._0_4_ = auVar141._0_4_;
          lVar10 = 0;
          local_218 = _DAT_01f7aa00;
          local_1c8 = _DAT_01f7aa00;
          auVar49 = _DAT_01f7a9f0;
          auVar141 = _DAT_01f7a9f0;
          auVar22 = _DAT_01f7aa00;
          auVar133 = _DAT_01f7a9f0;
          bVar21 = true;
          do {
            bVar13 = bVar21;
            iVar15 = (int)lVar10;
            lVar12 = lVar10 * 4;
            fVar90 = *(float *)(bezier_basis0 + lVar12 + 0x1dc);
            fVar91 = *(float *)(bezier_basis0 + lVar12 + 0x1e0);
            fVar102 = *(float *)(bezier_basis0 + lVar12 + 0x1e4);
            fVar93 = *(float *)(bezier_basis0 + lVar12 + 0x1e8);
            lVar12 = lVar10 * 4;
            fVar100 = *(float *)(bezier_basis0 + lVar12 + 0x660);
            fVar101 = *(float *)(bezier_basis0 + lVar12 + 0x664);
            fVar115 = *(float *)(bezier_basis0 + lVar12 + 0x668);
            fVar103 = *(float *)(bezier_basis0 + lVar12 + 0x66c);
            lVar12 = lVar10 * 4;
            fVar113 = *(float *)(bezier_basis0 + lVar12 + 0xae4);
            fVar114 = *(float *)(bezier_basis0 + lVar12 + 0xae8);
            fVar130 = *(float *)(bezier_basis0 + lVar12 + 0xaec);
            fVar48 = *(float *)(bezier_basis0 + lVar12 + 0xaf0);
            lVar12 = lVar10 * 4;
            fVar74 = *(float *)(bezier_basis0 + lVar12 + 0xf68);
            fVar116 = *(float *)(bezier_basis0 + lVar12 + 0xf6c);
            fVar127 = *(float *)(bezier_basis0 + lVar12 + 0xf70);
            fVar129 = *(float *)(bezier_basis0 + lVar12 + 0xf74);
            auVar166._0_4_ =
                 fVar190 * fVar90 + fVar178 * fVar100 + fVar179 * fVar113 + fVar191 * fVar74;
            auVar166._4_4_ =
                 fVar190 * fVar91 + fVar178 * fVar101 + fVar179 * fVar114 + fVar191 * fVar116;
            auVar166._8_4_ =
                 fVar190 * fVar102 + fVar178 * fVar115 + fVar179 * fVar130 + fVar191 * fVar127;
            auVar166._12_4_ =
                 fVar190 * fVar93 + fVar178 * fVar103 + fVar179 * fVar48 + fVar191 * fVar129;
            auVar160._0_4_ =
                 fVar193 * fVar90 + fVar92 * fVar100 + fVar172 * fVar113 + fVar194 * fVar74;
            auVar160._4_4_ =
                 fVar193 * fVar91 + fVar92 * fVar101 + fVar172 * fVar114 + fVar194 * fVar116;
            auVar160._8_4_ =
                 fVar193 * fVar102 + fVar92 * fVar115 + fVar172 * fVar130 + fVar194 * fVar127;
            auVar160._12_4_ =
                 fVar193 * fVar93 + fVar92 * fVar103 + fVar172 * fVar48 + fVar194 * fVar129;
            auVar119._0_4_ =
                 fVar90 * fVar196 + fVar100 * fVar75 + fVar113 * fVar177 + fVar74 * fVar197;
            auVar119._4_4_ =
                 fVar91 * fVar196 + fVar101 * fVar75 + fVar114 * fVar177 + fVar116 * fVar197;
            auVar119._8_4_ =
                 fVar102 * fVar196 + fVar115 * fVar75 + fVar130 * fVar177 + fVar127 * fVar197;
            auVar119._12_4_ =
                 fVar93 * fVar196 + fVar103 * fVar75 + fVar48 * fVar177 + fVar129 * fVar197;
            lVar12 = lVar10 * 4;
            fVar90 = *(float *)(bezier_basis0 + lVar12 + 0x13ec);
            fVar91 = *(float *)(bezier_basis0 + lVar12 + 0x13f0);
            fVar102 = *(float *)(bezier_basis0 + lVar12 + 0x13f4);
            fVar93 = *(float *)(bezier_basis0 + lVar12 + 0x13f8);
            lVar12 = lVar10 * 4;
            fVar100 = *(float *)(bezier_basis0 + lVar12 + 0x1cf4);
            fVar101 = *(float *)(bezier_basis0 + lVar12 + 0x1cf8);
            fVar115 = *(float *)(bezier_basis0 + lVar12 + 0x1cfc);
            fVar103 = *(float *)(bezier_basis0 + lVar12 + 0x1d00);
            lVar12 = lVar10 * 4;
            fVar113 = *(float *)(bezier_basis0 + lVar12 + 0x2178);
            fVar114 = *(float *)(bezier_basis0 + lVar12 + 0x217c);
            fVar130 = *(float *)(bezier_basis0 + lVar12 + 0x2180);
            fVar48 = *(float *)(bezier_basis0 + lVar12 + 0x2184);
            lVar10 = lVar10 * 4;
            fVar74 = *(float *)(bezier_basis0 + lVar10 + 0x1870);
            fVar116 = *(float *)(bezier_basis0 + lVar10 + 0x1874);
            fVar127 = *(float *)(bezier_basis0 + lVar10 + 0x1878);
            fVar129 = *(float *)(bezier_basis0 + lVar10 + 0x187c);
            fVar146 = fVar190 * fVar90 + fVar178 * fVar74 + fVar179 * fVar100 + fVar191 * fVar113;
            fVar148 = fVar190 * fVar91 + fVar178 * fVar116 + fVar179 * fVar101 + fVar191 * fVar114;
            fVar139 = fVar190 * fVar102 + fVar178 * fVar127 + fVar179 * fVar115 + fVar191 * fVar130;
            fVar145 = fVar190 * fVar93 + fVar178 * fVar129 + fVar179 * fVar103 + fVar191 * fVar48;
            fVar137 = fVar193 * fVar90 + fVar92 * fVar74 + fVar172 * fVar100 + fVar194 * fVar113;
            fVar138 = fVar193 * fVar91 + fVar92 * fVar116 + fVar172 * fVar101 + fVar194 * fVar114;
            fVar140 = fVar193 * fVar102 + fVar92 * fVar127 + fVar172 * fVar115 + fVar194 * fVar130;
            fVar158 = fVar193 * fVar93 + fVar92 * fVar129 + fVar172 * fVar103 + fVar194 * fVar48;
            fVar90 = fVar90 * fVar196 + fVar74 * fVar75 + fVar100 * fVar177 + fVar113 * fVar197;
            fVar91 = fVar91 * fVar196 + fVar116 * fVar75 + fVar101 * fVar177 + fVar114 * fVar197;
            fVar102 = fVar102 * fVar196 + fVar127 * fVar75 + fVar115 * fVar177 + fVar130 * fVar197;
            fVar93 = fVar93 * fVar196 + fVar129 * fVar75 + fVar103 * fVar177 + fVar48 * fVar197;
            uVar150 = -(uint)(iVar15 == 0);
            uVar154 = -(uint)(iVar15 == 1);
            uVar156 = -(uint)(iVar15 == 2);
            uVar157 = -(uint)(iVar15 == 3);
            uVar202 = -(uint)(iVar15 == 7);
            uVar205 = -(uint)(iVar15 == 6);
            uVar206 = -(uint)(iVar15 == 5);
            uVar207 = -(uint)(iVar15 == 4);
            auVar53._0_4_ = (float)(~uVar202 & (uint)fVar146) * 0.055555556 + auVar166._0_4_;
            auVar53._4_4_ = (float)(~uVar205 & (uint)fVar148) * 0.055555556 + auVar166._4_4_;
            auVar53._8_4_ = (float)(~uVar206 & (uint)fVar139) * 0.055555556 + auVar166._8_4_;
            auVar53._12_4_ = (float)(~uVar207 & (uint)fVar145) * 0.055555556 + auVar166._12_4_;
            auVar134 = minps(auVar141,auVar166);
            auVar118 = maxps(local_1c8,auVar166);
            auVar167._0_8_ =
                 CONCAT44(auVar166._4_4_ - (float)(~uVar154 & (uint)fVar148) * 0.055555556,
                          auVar166._0_4_ - (float)(~uVar150 & (uint)fVar146) * 0.055555556);
            auVar167._8_4_ = auVar166._8_4_ - (float)(~uVar156 & (uint)fVar139) * 0.055555556;
            auVar167._12_4_ = auVar166._12_4_ - (float)(~uVar157 & (uint)fVar145) * 0.055555556;
            auVar78._0_4_ = (float)(~uVar202 & (uint)fVar137) * 0.055555556 + auVar160._0_4_;
            auVar78._4_4_ = (float)(~uVar205 & (uint)fVar138) * 0.055555556 + auVar160._4_4_;
            auVar78._8_4_ = (float)(~uVar206 & (uint)fVar140) * 0.055555556 + auVar160._8_4_;
            auVar78._12_4_ = (float)(~uVar207 & (uint)fVar158) * 0.055555556 + auVar160._12_4_;
            auVar49 = minps(auVar49,auVar160);
            auVar143 = maxps(local_218,auVar160);
            auVar161._0_8_ =
                 CONCAT44(auVar160._4_4_ - (float)(~uVar154 & (uint)fVar138) * 0.055555556,
                          auVar160._0_4_ - (float)(~uVar150 & (uint)fVar137) * 0.055555556);
            auVar161._8_4_ = auVar160._8_4_ - (float)(~uVar156 & (uint)fVar140) * 0.055555556;
            auVar161._12_4_ = auVar160._12_4_ - (float)(~uVar157 & (uint)fVar158) * 0.055555556;
            auVar204._0_4_ = (float)(~uVar202 & (uint)fVar90) * 0.055555556 + auVar119._0_4_;
            auVar204._4_4_ = (float)(~uVar205 & (uint)fVar91) * 0.055555556 + auVar119._4_4_;
            auVar204._8_4_ = (float)(~uVar206 & (uint)fVar102) * 0.055555556 + auVar119._8_4_;
            auVar204._12_4_ = (float)(~uVar207 & (uint)fVar93) * 0.055555556 + auVar119._12_4_;
            auVar133 = minps(auVar133,auVar119);
            auVar176 = maxps(auVar22,auVar119);
            auVar120._0_8_ =
                 CONCAT44(auVar119._4_4_ - (float)(~uVar154 & (uint)fVar91) * 0.055555556,
                          auVar119._0_4_ - (float)(~uVar150 & (uint)fVar90) * 0.055555556);
            auVar120._8_4_ = auVar119._8_4_ - (float)(~uVar156 & (uint)fVar102) * 0.055555556;
            auVar120._12_4_ = auVar119._12_4_ - (float)(~uVar157 & (uint)fVar93) * 0.055555556;
            auVar106._8_4_ = auVar167._8_4_;
            auVar106._0_8_ = auVar167._0_8_;
            auVar106._12_4_ = auVar167._12_4_;
            auVar141 = minps(auVar106,auVar53);
            auVar141 = minps(auVar134,auVar141);
            auVar107._8_4_ = auVar161._8_4_;
            auVar107._0_8_ = auVar161._0_8_;
            auVar107._12_4_ = auVar161._12_4_;
            auVar22 = minps(auVar107,auVar78);
            auVar49 = minps(auVar49,auVar22);
            auVar108._8_4_ = auVar120._8_4_;
            auVar108._0_8_ = auVar120._0_8_;
            auVar108._12_4_ = auVar120._12_4_;
            auVar22 = minps(auVar108,auVar204);
            auVar133 = minps(auVar133,auVar22);
            auVar22 = maxps(auVar167,auVar53);
            local_1c8 = maxps(auVar118,auVar22);
            auVar22 = maxps(auVar161,auVar78);
            local_218 = maxps(auVar143,auVar22);
            auVar22 = maxps(auVar120,auVar204);
            auVar22 = maxps(auVar176,auVar22);
            lVar10 = 4;
            bVar21 = false;
          } while (bVar13);
          auVar159 = minps(auVar25,auVar159);
          auVar109._8_4_ = auVar159._0_4_;
          auVar109._12_4_ = 0;
          auVar50 = maxps(auVar29,auVar50);
          auVar121._8_4_ = auVar50._0_4_;
          auVar121._12_4_ = 0;
          auVar54._4_4_ = auVar141._0_4_;
          auVar54._0_4_ = auVar141._4_4_;
          auVar54._8_4_ = auVar141._12_4_;
          auVar54._12_4_ = auVar141._8_4_;
          auVar141 = minps(auVar54,auVar141);
          auVar79._0_8_ = auVar141._8_8_;
          auVar79._8_4_ = auVar141._0_4_;
          auVar79._12_4_ = auVar141._4_4_;
          auVar141 = minps(auVar79,auVar141);
          auVar55._4_4_ = auVar49._0_4_;
          auVar55._0_4_ = auVar49._4_4_;
          auVar55._8_4_ = auVar49._12_4_;
          auVar55._12_4_ = auVar49._8_4_;
          auVar49 = minps(auVar55,auVar49);
          auVar96._0_8_ = auVar49._8_8_;
          auVar96._8_4_ = auVar49._0_4_;
          auVar96._12_4_ = auVar49._4_4_;
          auVar50 = minps(auVar96,auVar49);
          auVar56._4_4_ = auVar133._0_4_;
          auVar56._0_4_ = auVar133._4_4_;
          auVar56._8_4_ = auVar133._12_4_;
          auVar56._12_4_ = auVar133._8_4_;
          auVar49 = minps(auVar56,auVar133);
          auVar80._0_8_ = auVar49._8_8_;
          auVar80._8_4_ = auVar49._0_4_;
          auVar80._12_4_ = auVar49._4_4_;
          auVar49 = minps(auVar80,auVar49);
          auVar97._4_4_ = auVar50._0_4_;
          auVar97._0_4_ = auVar141._0_4_;
          auVar97._8_4_ = auVar49._0_4_;
          auVar97._12_4_ = 0;
          auVar50 = minps(auVar109,auVar97);
          auVar57._4_4_ = local_1c8._0_4_;
          auVar57._0_4_ = local_1c8._4_4_;
          auVar57._8_4_ = local_1c8._12_4_;
          auVar57._12_4_ = local_1c8._8_4_;
          auVar49 = maxps(auVar57,local_1c8);
          auVar81._0_8_ = auVar49._8_8_;
          auVar81._8_4_ = auVar49._0_4_;
          auVar81._12_4_ = auVar49._4_4_;
          auVar133 = maxps(auVar81,auVar49);
          auVar58._4_4_ = local_218._0_4_;
          auVar58._0_4_ = local_218._4_4_;
          auVar58._8_4_ = local_218._12_4_;
          auVar58._12_4_ = local_218._8_4_;
          auVar49 = maxps(auVar58,local_218);
          auVar30._0_8_ = auVar49._8_8_;
          auVar30._8_4_ = auVar49._0_4_;
          auVar30._12_4_ = auVar49._4_4_;
          auVar49 = maxps(auVar30,auVar49);
          auVar59._4_4_ = auVar22._0_4_;
          auVar59._0_4_ = auVar22._4_4_;
          auVar59._8_4_ = auVar22._12_4_;
          auVar59._12_4_ = auVar22._8_4_;
          auVar141 = maxps(auVar59,auVar22);
          auVar82._0_8_ = auVar141._8_8_;
          auVar82._8_4_ = auVar141._0_4_;
          auVar82._12_4_ = auVar141._4_4_;
          auVar141 = maxps(auVar82,auVar141);
          auVar31._4_4_ = auVar49._0_4_;
          auVar31._0_4_ = auVar133._0_4_;
          auVar31._8_4_ = auVar141._0_4_;
          auVar31._12_4_ = 0;
          auVar49 = maxps(auVar121,auVar31);
          auVar122._0_4_ = -(uint)(auVar49._0_4_ < 1.844e+18 && -1.844e+18 < auVar50._0_4_);
          auVar122._4_4_ = -(uint)(auVar49._4_4_ < 1.844e+18 && -1.844e+18 < auVar50._4_4_);
          auVar122._8_4_ = -(uint)(auVar49._8_4_ < 1.844e+18 && -1.844e+18 < auVar50._8_4_);
          auVar122._12_4_ = -(uint)(auVar49._12_4_ < 1.844e+18 && -1.844e+18 < auVar50._12_4_);
          uVar11 = movmskps((int)(sVar8 * uVar20),auVar122);
          if ((~(byte)uVar11 & 7) != 0) goto LAB_009da0b0;
          bVar21 = uVar16 != (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                             super_CurveGeometry.super_Geometry.numTimeSteps - 1;
          uVar16 = uVar16 + 1;
        } while (bVar21);
        pcVar7 = (pBVar5->super_RawBufferView).ptr_ofs;
        sVar8 = (pBVar5->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar7 + sVar8 * uVar14);
        fVar179 = *pfVar1;
        fVar172 = pfVar1[1];
        fVar177 = pfVar1[2];
        pfVar2 = (float *)(pcVar7 + sVar8 * uVar19);
        fVar178 = *pfVar2;
        fVar92 = pfVar2[1];
        fVar75 = pfVar2[2];
        pfVar3 = (float *)(pcVar7 + sVar8 * uVar20);
        fVar90 = *pfVar3;
        fVar91 = pfVar3[1];
        fVar102 = pfVar3[2];
        pfVar4 = (float *)(pcVar7 + sVar8 * uVar18);
        fVar93 = *pfVar4;
        fVar100 = pfVar4[1];
        fVar101 = pfVar4[2];
        fVar104 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .maxRadiusScale;
        fVar190 = pfVar1[3] * fVar104;
        fVar193 = pfVar2[3] * fVar104;
        fVar196 = pfVar3[3] * fVar104;
        fVar104 = pfVar4[3] * fVar104;
        pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar8 = (pBVar6->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar7 + uVar14 * sVar8);
        fVar115 = *pfVar1;
        fVar103 = pfVar1[1];
        fVar113 = pfVar1[2];
        pfVar1 = (float *)(pcVar7 + uVar19 * sVar8);
        fVar114 = *pfVar1;
        fVar130 = pfVar1[1];
        fVar48 = pfVar1[2];
        pfVar1 = (float *)(pcVar7 + uVar20 * sVar8);
        fVar74 = *pfVar1;
        fVar116 = pfVar1[1];
        fVar127 = pfVar1[2];
        pfVar1 = (float *)(pcVar7 + sVar8 * uVar18);
        fVar129 = *pfVar1;
        fVar137 = pfVar1[1];
        fVar138 = pfVar1[2];
        fVar194 = fVar90 * 0.0 + fVar93 * -0.0 + fVar178 + fVar179 * -0.0;
        fVar197 = fVar91 * 0.0 + fVar100 * -0.0 + fVar92 + fVar172 * -0.0;
        fVar153 = fVar102 * 0.0 + fVar101 * -0.0 + fVar75 + fVar177 * -0.0;
        fVar180 = fVar196 * 0.0 + fVar104 * -0.0 + fVar193 + fVar190 * -0.0;
        fVar140 = (fVar90 * 0.5 + fVar93 * 0.0 + fVar178 * 0.0) - fVar179 * 0.5;
        fVar158 = (fVar91 * 0.5 + fVar100 * 0.0 + fVar92 * 0.0) - fVar172 * 0.5;
        fVar146 = (fVar102 * 0.5 + fVar101 * 0.0 + fVar75 * 0.0) - fVar177 * 0.5;
        fVar148 = (fVar196 * 0.5 + fVar104 * 0.0 + fVar193 * 0.0) - fVar190 * 0.5;
        fVar147 = (fVar74 * 0.5 + fVar129 * 0.0 + fVar114 * 0.0) - fVar115 * 0.5;
        fVar149 = (fVar116 * 0.5 + fVar137 * 0.0 + fVar130 * 0.0) - fVar103 * 0.5;
        fVar155 = (fVar127 * 0.5 + fVar138 * 0.0 + fVar48 * 0.0) - fVar113 * 0.5;
        fVar184 = fVar74 * 0.0 + fVar129 * -0.0 + fVar114 + fVar115 * -0.0;
        fVar186 = fVar116 * 0.0 + fVar137 * -0.0 + fVar130 + fVar103 * -0.0;
        fVar188 = fVar127 * 0.0 + fVar138 * -0.0 + fVar48 + fVar113 * -0.0;
        fVar139 = fVar93 * -0.0 + fVar90 + fVar178 * 0.0 + fVar179 * -0.0;
        fVar191 = fVar100 * -0.0 + fVar91 + fVar92 * 0.0 + fVar172 * -0.0;
        fVar145 = fVar101 * -0.0 + fVar102 + fVar75 * 0.0 + fVar177 * -0.0;
        fVar199 = fVar104 * -0.0 + fVar196 + fVar193 * 0.0 + fVar190 * -0.0;
        fVar192 = fVar179 * 0.0 + ((fVar93 * 0.5 + fVar90 * 0.0) - fVar178 * 0.5);
        fVar195 = fVar172 * 0.0 + ((fVar100 * 0.5 + fVar91 * 0.0) - fVar92 * 0.5);
        fVar198 = fVar177 * 0.0 + ((fVar101 * 0.5 + fVar102 * 0.0) - fVar75 * 0.5);
        fVar190 = fVar190 * 0.0 + ((fVar104 * 0.5 + fVar196 * 0.0) - fVar193 * 0.5);
        fVar177 = fVar129 * -0.0 + fVar74 + fVar114 * 0.0 + fVar115 * -0.0;
        fVar178 = fVar137 * -0.0 + fVar116 + fVar130 * 0.0 + fVar103 * -0.0;
        fVar92 = fVar138 * -0.0 + fVar127 + fVar48 * 0.0 + fVar113 * -0.0;
        fVar104 = fVar115 * 0.0 + ((fVar129 * 0.5 + fVar74 * 0.0) - fVar114 * 0.5);
        fVar179 = fVar103 * 0.0 + ((fVar137 * 0.5 + fVar116 * 0.0) - fVar130 * 0.5);
        fVar172 = fVar113 * 0.0 + ((fVar138 * 0.5 + fVar127 * 0.0) - fVar48 * 0.5);
        fVar48 = fVar158 * fVar184 - fVar186 * fVar140;
        fVar74 = fVar146 * fVar186 - fVar188 * fVar158;
        fVar116 = fVar140 * fVar188 - fVar184 * fVar146;
        fVar103 = fVar158 * fVar147 - fVar149 * fVar140;
        fVar113 = fVar146 * fVar149 - fVar155 * fVar158;
        fVar114 = fVar140 * fVar155 - fVar147 * fVar146;
        fVar90 = fVar195 * fVar177 - fVar178 * fVar192;
        fVar93 = fVar198 * fVar178 - fVar92 * fVar195;
        fVar101 = fVar192 * fVar92 - fVar177 * fVar198;
        fVar177 = fVar195 * fVar104 - fVar179 * fVar192;
        fVar92 = fVar198 * fVar179 - fVar172 * fVar195;
        fVar75 = fVar192 * fVar172 - fVar104 * fVar198;
        fVar179 = fVar116 * fVar116 + fVar74 * fVar74 + fVar48 * fVar48;
        auVar141 = ZEXT416((uint)fVar179);
        auVar49 = rsqrtss(ZEXT416((uint)fVar179),auVar141);
        fVar104 = auVar49._0_4_;
        fVar172 = fVar104 * 1.5 - fVar104 * fVar104 * fVar179 * 0.5 * fVar104;
        fVar127 = fVar48 * fVar103 + fVar116 * fVar114 + fVar74 * fVar113;
        auVar49 = rcpss(auVar141,auVar141);
        fVar104 = (2.0 - fVar179 * auVar49._0_4_) * auVar49._0_4_;
        fVar130 = fVar101 * fVar101 + fVar93 * fVar93 + fVar90 * fVar90;
        auVar49 = ZEXT416((uint)fVar130);
        auVar141 = rsqrtss(ZEXT416((uint)fVar130),auVar49);
        fVar178 = auVar141._0_4_;
        fVar91 = fVar178 * 1.5 - fVar178 * fVar178 * fVar130 * 0.5 * fVar178;
        fVar129 = fVar90 * fVar177 + fVar101 * fVar75 + fVar93 * fVar92;
        auVar49 = rcpss(auVar49,auVar49);
        fVar178 = (2.0 - fVar130 * auVar49._0_4_) * auVar49._0_4_;
        fVar102 = fVar180 * fVar74 * fVar172;
        fVar100 = fVar180 * fVar116 * fVar172;
        fVar115 = fVar180 * fVar48 * fVar172;
        fVar137 = fVar194 - fVar102;
        fVar138 = fVar197 - fVar100;
        fVar193 = fVar153 - fVar115;
        fVar113 = fVar180 * fVar104 * (fVar179 * fVar113 - fVar127 * fVar74) * fVar172 +
                  fVar148 * fVar74 * fVar172;
        fVar114 = fVar180 * fVar104 * (fVar179 * fVar114 - fVar127 * fVar116) * fVar172 +
                  fVar148 * fVar116 * fVar172;
        fVar48 = fVar180 * fVar104 * (fVar179 * fVar103 - fVar127 * fVar48) * fVar172 +
                 fVar148 * fVar48 * fVar172;
        fVar104 = fVar199 * fVar93 * fVar91;
        fVar179 = fVar199 * fVar101 * fVar91;
        fVar172 = fVar199 * fVar90 * fVar91;
        fVar74 = fVar139 - fVar104;
        fVar116 = fVar191 - fVar179;
        fVar127 = fVar145 - fVar172;
        fVar93 = fVar199 * fVar178 * (fVar130 * fVar92 - fVar129 * fVar93) * fVar91 +
                 fVar190 * fVar93 * fVar91;
        fVar75 = fVar199 * fVar178 * (fVar130 * fVar75 - fVar129 * fVar101) * fVar91 +
                 fVar190 * fVar101 * fVar91;
        fVar90 = fVar199 * fVar178 * (fVar130 * fVar177 - fVar129 * fVar90) * fVar91 +
                 fVar190 * fVar90 * fVar91;
        fVar91 = (fVar140 - fVar113) * 0.33333334 + fVar137;
        fVar101 = (fVar158 - fVar114) * 0.33333334 + fVar138;
        fVar103 = (fVar146 - fVar48) * 0.33333334 + fVar193;
        fVar177 = fVar74 - (fVar192 - fVar93) * 0.33333334;
        fVar178 = fVar116 - (fVar195 - fVar75) * 0.33333334;
        fVar92 = fVar127 - (fVar198 - fVar90) * 0.33333334;
        lVar10 = 0;
        local_228 = _DAT_01f7aa00;
        auVar49 = _DAT_01f7a9f0;
        auVar141 = _DAT_01f7aa00;
        auVar22 = _DAT_01f7a9f0;
        auVar133 = _DAT_01f7a9f0;
        auVar50 = _DAT_01f7aa00;
        bVar21 = true;
        do {
          bVar13 = bVar21;
          iVar15 = (int)lVar10;
          lVar12 = lVar10 * 4;
          fVar130 = *(float *)(bezier_basis0 + lVar12 + 0x1dc);
          fVar129 = *(float *)(bezier_basis0 + lVar12 + 0x1e0);
          fVar148 = *(float *)(bezier_basis0 + lVar12 + 0x1e4);
          fVar190 = *(float *)(bezier_basis0 + lVar12 + 0x1e8);
          lVar12 = lVar10 * 4;
          fVar196 = *(float *)(bezier_basis0 + lVar12 + 0x660);
          fVar147 = *(float *)(bezier_basis0 + lVar12 + 0x664);
          fVar149 = *(float *)(bezier_basis0 + lVar12 + 0x668);
          fVar155 = *(float *)(bezier_basis0 + lVar12 + 0x66c);
          lVar12 = lVar10 * 4;
          fVar180 = *(float *)(bezier_basis0 + lVar12 + 0xae4);
          fVar184 = *(float *)(bezier_basis0 + lVar12 + 0xae8);
          fVar186 = *(float *)(bezier_basis0 + lVar12 + 0xaec);
          fVar188 = *(float *)(bezier_basis0 + lVar12 + 0xaf0);
          lVar12 = lVar10 * 4;
          fVar199 = *(float *)(bezier_basis0 + lVar12 + 0xf68);
          fVar200 = *(float *)(bezier_basis0 + lVar12 + 0xf6c);
          fVar201 = *(float *)(bezier_basis0 + lVar12 + 0xf70);
          fVar9 = *(float *)(bezier_basis0 + lVar12 + 0xf74);
          auVar168._0_4_ =
               fVar137 * fVar130 + fVar91 * fVar196 + fVar177 * fVar180 + fVar74 * fVar199;
          auVar168._4_4_ =
               fVar137 * fVar129 + fVar91 * fVar147 + fVar177 * fVar184 + fVar74 * fVar200;
          auVar168._8_4_ =
               fVar137 * fVar148 + fVar91 * fVar149 + fVar177 * fVar186 + fVar74 * fVar201;
          auVar168._12_4_ =
               fVar137 * fVar190 + fVar91 * fVar155 + fVar177 * fVar188 + fVar74 * fVar9;
          auVar60._0_4_ =
               fVar138 * fVar130 + fVar101 * fVar196 + fVar178 * fVar180 + fVar116 * fVar199;
          auVar60._4_4_ =
               fVar138 * fVar129 + fVar101 * fVar147 + fVar178 * fVar184 + fVar116 * fVar200;
          auVar60._8_4_ =
               fVar138 * fVar148 + fVar101 * fVar149 + fVar178 * fVar186 + fVar116 * fVar201;
          auVar60._12_4_ =
               fVar138 * fVar190 + fVar101 * fVar155 + fVar178 * fVar188 + fVar116 * fVar9;
          auVar151._0_4_ =
               fVar130 * fVar193 + fVar196 * fVar103 + fVar180 * fVar92 + fVar199 * fVar127;
          auVar151._4_4_ =
               fVar129 * fVar193 + fVar147 * fVar103 + fVar184 * fVar92 + fVar200 * fVar127;
          auVar151._8_4_ =
               fVar148 * fVar193 + fVar149 * fVar103 + fVar186 * fVar92 + fVar201 * fVar127;
          auVar151._12_4_ =
               fVar190 * fVar193 + fVar155 * fVar103 + fVar188 * fVar92 + fVar9 * fVar127;
          lVar12 = lVar10 * 4;
          fVar130 = *(float *)(bezier_basis0 + lVar12 + 0x13ec);
          fVar129 = *(float *)(bezier_basis0 + lVar12 + 0x13f0);
          fVar148 = *(float *)(bezier_basis0 + lVar12 + 0x13f4);
          fVar190 = *(float *)(bezier_basis0 + lVar12 + 0x13f8);
          lVar12 = lVar10 * 4;
          fVar196 = *(float *)(bezier_basis0 + lVar12 + 0x1cf4);
          fVar147 = *(float *)(bezier_basis0 + lVar12 + 0x1cf8);
          fVar149 = *(float *)(bezier_basis0 + lVar12 + 0x1cfc);
          fVar155 = *(float *)(bezier_basis0 + lVar12 + 0x1d00);
          lVar12 = lVar10 * 4;
          fVar180 = *(float *)(bezier_basis0 + lVar12 + 0x2178);
          fVar184 = *(float *)(bezier_basis0 + lVar12 + 0x217c);
          fVar186 = *(float *)(bezier_basis0 + lVar12 + 0x2180);
          fVar188 = *(float *)(bezier_basis0 + lVar12 + 0x2184);
          lVar10 = lVar10 * 4;
          fVar199 = *(float *)(bezier_basis0 + lVar10 + 0x1870);
          fVar200 = *(float *)(bezier_basis0 + lVar10 + 0x1874);
          fVar201 = *(float *)(bezier_basis0 + lVar10 + 0x1878);
          fVar9 = *(float *)(bezier_basis0 + lVar10 + 0x187c);
          fVar132 = fVar137 * fVar130 + fVar91 * fVar199 + fVar177 * fVar196 + fVar74 * fVar180;
          fVar181 = fVar137 * fVar129 + fVar91 * fVar200 + fVar177 * fVar147 + fVar74 * fVar184;
          fVar185 = fVar137 * fVar148 + fVar91 * fVar201 + fVar177 * fVar149 + fVar74 * fVar186;
          fVar187 = fVar137 * fVar190 + fVar91 * fVar9 + fVar177 * fVar155 + fVar74 * fVar188;
          fVar173 = fVar138 * fVar130 + fVar101 * fVar199 + fVar178 * fVar196 + fVar116 * fVar180;
          fVar117 = fVar138 * fVar129 + fVar101 * fVar200 + fVar178 * fVar147 + fVar116 * fVar184;
          fVar128 = fVar138 * fVar148 + fVar101 * fVar201 + fVar178 * fVar149 + fVar116 * fVar186;
          fVar131 = fVar138 * fVar190 + fVar101 * fVar9 + fVar178 * fVar155 + fVar116 * fVar188;
          fVar130 = fVar130 * fVar193 + fVar199 * fVar103 + fVar196 * fVar92 + fVar180 * fVar127;
          fVar129 = fVar129 * fVar193 + fVar200 * fVar103 + fVar147 * fVar92 + fVar184 * fVar127;
          fVar148 = fVar148 * fVar193 + fVar201 * fVar103 + fVar149 * fVar92 + fVar186 * fVar127;
          fVar190 = fVar190 * fVar193 + fVar9 * fVar103 + fVar155 * fVar92 + fVar188 * fVar127;
          uVar150 = -(uint)(iVar15 == 0);
          uVar154 = -(uint)(iVar15 == 1);
          uVar156 = -(uint)(iVar15 == 2);
          uVar157 = -(uint)(iVar15 == 3);
          uVar202 = -(uint)(iVar15 == 7);
          uVar205 = -(uint)(iVar15 == 6);
          uVar206 = -(uint)(iVar15 == 5);
          uVar207 = -(uint)(iVar15 == 4);
          auVar144._0_4_ = (float)(~uVar202 & (uint)fVar132) * 0.055555556 + auVar168._0_4_;
          auVar144._4_4_ = (float)(~uVar205 & (uint)fVar181) * 0.055555556 + auVar168._4_4_;
          auVar144._8_4_ = (float)(~uVar206 & (uint)fVar185) * 0.055555556 + auVar168._8_4_;
          auVar144._12_4_ = (float)(~uVar207 & (uint)fVar187) * 0.055555556 + auVar168._12_4_;
          auVar159 = minps(auVar49,auVar168);
          auVar50 = maxps(auVar50,auVar168);
          auVar169._0_8_ =
               CONCAT44(auVar168._4_4_ - (float)(~uVar154 & (uint)fVar181) * 0.055555556,
                        auVar168._0_4_ - (float)(~uVar150 & (uint)fVar132) * 0.055555556);
          auVar169._8_4_ = auVar168._8_4_ - (float)(~uVar156 & (uint)fVar185) * 0.055555556;
          auVar169._12_4_ = auVar168._12_4_ - (float)(~uVar157 & (uint)fVar187) * 0.055555556;
          auVar83._0_4_ = (float)(~uVar202 & (uint)fVar173) * 0.055555556 + auVar60._0_4_;
          auVar83._4_4_ = (float)(~uVar205 & (uint)fVar117) * 0.055555556 + auVar60._4_4_;
          auVar83._8_4_ = (float)(~uVar206 & (uint)fVar128) * 0.055555556 + auVar60._8_4_;
          auVar83._12_4_ = (float)(~uVar207 & (uint)fVar131) * 0.055555556 + auVar60._12_4_;
          auVar22 = minps(auVar22,auVar60);
          auVar134 = maxps(local_228,auVar60);
          auVar61._0_8_ =
               CONCAT44(auVar60._4_4_ - (float)(~uVar154 & (uint)fVar117) * 0.055555556,
                        auVar60._0_4_ - (float)(~uVar150 & (uint)fVar173) * 0.055555556);
          auVar61._8_4_ = auVar60._8_4_ - (float)(~uVar156 & (uint)fVar128) * 0.055555556;
          auVar61._12_4_ = auVar60._12_4_ - (float)(~uVar157 & (uint)fVar131) * 0.055555556;
          auVar162._0_4_ = (float)(~uVar202 & (uint)fVar130) * 0.055555556 + auVar151._0_4_;
          auVar162._4_4_ = (float)(~uVar205 & (uint)fVar129) * 0.055555556 + auVar151._4_4_;
          auVar162._8_4_ = (float)(~uVar206 & (uint)fVar148) * 0.055555556 + auVar151._8_4_;
          auVar162._12_4_ = (float)(~uVar207 & (uint)fVar190) * 0.055555556 + auVar151._12_4_;
          auVar133 = minps(auVar133,auVar151);
          auVar118 = maxps(auVar141,auVar151);
          auVar152._0_8_ =
               CONCAT44(auVar151._4_4_ - (float)(~uVar154 & (uint)fVar129) * 0.055555556,
                        auVar151._0_4_ - (float)(~uVar150 & (uint)fVar130) * 0.055555556);
          auVar152._8_4_ = auVar151._8_4_ - (float)(~uVar156 & (uint)fVar148) * 0.055555556;
          auVar152._12_4_ = auVar151._12_4_ - (float)(~uVar157 & (uint)fVar190) * 0.055555556;
          auVar32._8_4_ = auVar169._8_4_;
          auVar32._0_8_ = auVar169._0_8_;
          auVar32._12_4_ = auVar169._12_4_;
          auVar49 = minps(auVar32,auVar144);
          auVar49 = minps(auVar159,auVar49);
          auVar33._8_4_ = auVar61._8_4_;
          auVar33._0_8_ = auVar61._0_8_;
          auVar33._12_4_ = auVar61._12_4_;
          auVar141 = minps(auVar33,auVar83);
          auVar22 = minps(auVar22,auVar141);
          auVar34._8_4_ = auVar152._8_4_;
          auVar34._0_8_ = auVar152._0_8_;
          auVar34._12_4_ = auVar152._12_4_;
          auVar141 = minps(auVar34,auVar162);
          auVar133 = minps(auVar133,auVar141);
          auVar141 = maxps(auVar169,auVar144);
          auVar50 = maxps(auVar50,auVar141);
          auVar141 = maxps(auVar61,auVar83);
          local_228 = maxps(auVar134,auVar141);
          auVar141 = maxps(auVar152,auVar162);
          auVar141 = maxps(auVar118,auVar141);
          lVar10 = 4;
          bVar21 = false;
        } while (bVar13);
        fVar194 = fVar194 + fVar102;
        fVar197 = fVar197 + fVar100;
        fVar153 = fVar153 + fVar115;
        fVar139 = fVar139 + fVar104;
        fVar191 = fVar191 + fVar179;
        fVar145 = fVar145 + fVar172;
        fVar177 = (fVar113 + fVar140) * 0.33333334 + fVar194;
        fVar178 = (fVar114 + fVar158) * 0.33333334 + fVar197;
        fVar92 = (fVar48 + fVar146) * 0.33333334 + fVar153;
        fVar104 = fVar139 - (fVar93 + fVar192) * 0.33333334;
        fVar179 = fVar191 - (fVar75 + fVar195) * 0.33333334;
        fVar172 = fVar145 - (fVar90 + fVar198) * 0.33333334;
        auVar35._4_4_ = auVar49._0_4_;
        auVar35._0_4_ = auVar49._4_4_;
        auVar35._8_4_ = auVar49._12_4_;
        auVar35._12_4_ = auVar49._8_4_;
        auVar49 = minps(auVar35,auVar49);
        auVar62._0_8_ = auVar49._8_8_;
        auVar62._8_4_ = auVar49._0_4_;
        auVar62._12_4_ = auVar49._4_4_;
        auVar159 = minps(auVar62,auVar49);
        auVar36._4_4_ = auVar22._0_4_;
        auVar36._0_4_ = auVar22._4_4_;
        auVar36._8_4_ = auVar22._12_4_;
        auVar36._12_4_ = auVar22._8_4_;
        auVar49 = minps(auVar36,auVar22);
        auVar84._0_8_ = auVar49._8_8_;
        auVar84._8_4_ = auVar49._0_4_;
        auVar84._12_4_ = auVar49._4_4_;
        auVar49 = minps(auVar84,auVar49);
        auVar37._4_4_ = auVar133._0_4_;
        auVar37._0_4_ = auVar133._4_4_;
        auVar37._8_4_ = auVar133._12_4_;
        auVar37._12_4_ = auVar133._8_4_;
        auVar118 = minps(auVar37,auVar133);
        auVar38._0_8_ = auVar118._8_8_;
        auVar38._8_4_ = auVar118._0_4_;
        auVar38._12_4_ = auVar118._4_4_;
        auVar111._4_4_ = auVar49._0_4_;
        auVar111._0_4_ = auVar159._0_4_;
        auVar39._4_4_ = auVar50._0_4_;
        auVar39._0_4_ = auVar50._4_4_;
        auVar39._8_4_ = auVar50._12_4_;
        auVar39._12_4_ = auVar50._8_4_;
        auVar49 = maxps(auVar39,auVar50);
        auVar63._0_8_ = auVar49._8_8_;
        auVar63._8_4_ = auVar49._0_4_;
        auVar63._12_4_ = auVar49._4_4_;
        auVar22 = maxps(auVar63,auVar49);
        auVar40._4_4_ = local_228._0_4_;
        auVar40._0_4_ = local_228._4_4_;
        auVar40._8_4_ = local_228._12_4_;
        auVar40._12_4_ = local_228._8_4_;
        auVar49 = maxps(auVar40,local_228);
        auVar85._0_8_ = auVar49._8_8_;
        auVar85._8_4_ = auVar49._0_4_;
        auVar85._12_4_ = auVar49._4_4_;
        auVar49 = maxps(auVar85,auVar49);
        auVar41._4_4_ = auVar141._0_4_;
        auVar41._0_4_ = auVar141._4_4_;
        auVar41._8_4_ = auVar141._12_4_;
        auVar41._12_4_ = auVar141._8_4_;
        auVar134 = maxps(auVar41,auVar141);
        auVar42._0_8_ = auVar134._8_8_;
        auVar42._8_4_ = auVar134._0_4_;
        auVar42._12_4_ = auVar134._4_4_;
        auVar126._4_4_ = auVar49._0_4_;
        auVar126._0_4_ = auVar22._0_4_;
        lVar10 = 0;
        auVar49 = _DAT_01f7a9f0;
        auVar141 = _DAT_01f7a9f0;
        auVar22 = _DAT_01f7aa00;
        auVar133 = _DAT_01f7aa00;
        auVar50 = _DAT_01f7a9f0;
        auVar159 = _DAT_01f7aa00;
        bVar21 = true;
        do {
          bVar13 = bVar21;
          iVar15 = (int)lVar10;
          lVar12 = lVar10 * 4;
          fVar75 = *(float *)(bezier_basis0 + lVar12 + 0x1dc);
          fVar90 = *(float *)(bezier_basis0 + lVar12 + 0x1e0);
          fVar91 = *(float *)(bezier_basis0 + lVar12 + 0x1e4);
          fVar102 = *(float *)(bezier_basis0 + lVar12 + 0x1e8);
          lVar12 = lVar10 * 4;
          fVar93 = *(float *)(bezier_basis0 + lVar12 + 0x660);
          fVar100 = *(float *)(bezier_basis0 + lVar12 + 0x664);
          fVar101 = *(float *)(bezier_basis0 + lVar12 + 0x668);
          fVar115 = *(float *)(bezier_basis0 + lVar12 + 0x66c);
          lVar12 = lVar10 * 4;
          fVar103 = *(float *)(bezier_basis0 + lVar12 + 0xae4);
          fVar113 = *(float *)(bezier_basis0 + lVar12 + 0xae8);
          fVar114 = *(float *)(bezier_basis0 + lVar12 + 0xaec);
          fVar130 = *(float *)(bezier_basis0 + lVar12 + 0xaf0);
          lVar12 = lVar10 * 4;
          fVar48 = *(float *)(bezier_basis0 + lVar12 + 0xf68);
          fVar74 = *(float *)(bezier_basis0 + lVar12 + 0xf6c);
          fVar116 = *(float *)(bezier_basis0 + lVar12 + 0xf70);
          fVar127 = *(float *)(bezier_basis0 + lVar12 + 0xf74);
          auVar170._0_4_ =
               fVar194 * fVar75 + fVar177 * fVar93 + fVar104 * fVar103 + fVar139 * fVar48;
          auVar170._4_4_ =
               fVar194 * fVar90 + fVar177 * fVar100 + fVar104 * fVar113 + fVar139 * fVar74;
          auVar170._8_4_ =
               fVar194 * fVar91 + fVar177 * fVar101 + fVar104 * fVar114 + fVar139 * fVar116;
          auVar170._12_4_ =
               fVar194 * fVar102 + fVar177 * fVar115 + fVar104 * fVar130 + fVar139 * fVar127;
          auVar64._0_4_ = fVar197 * fVar75 + fVar178 * fVar93 + fVar179 * fVar103 + fVar191 * fVar48
          ;
          auVar64._4_4_ =
               fVar197 * fVar90 + fVar178 * fVar100 + fVar179 * fVar113 + fVar191 * fVar74;
          auVar64._8_4_ =
               fVar197 * fVar91 + fVar178 * fVar101 + fVar179 * fVar114 + fVar191 * fVar116;
          auVar64._12_4_ =
               fVar197 * fVar102 + fVar178 * fVar115 + fVar179 * fVar130 + fVar191 * fVar127;
          auVar182._0_4_ = fVar75 * fVar153 + fVar93 * fVar92 + fVar103 * fVar172 + fVar48 * fVar145
          ;
          auVar182._4_4_ =
               fVar90 * fVar153 + fVar100 * fVar92 + fVar113 * fVar172 + fVar74 * fVar145;
          auVar182._8_4_ =
               fVar91 * fVar153 + fVar101 * fVar92 + fVar114 * fVar172 + fVar116 * fVar145;
          auVar182._12_4_ =
               fVar102 * fVar153 + fVar115 * fVar92 + fVar130 * fVar172 + fVar127 * fVar145;
          lVar12 = lVar10 * 4;
          fVar75 = *(float *)(bezier_basis0 + lVar12 + 0x13ec);
          fVar90 = *(float *)(bezier_basis0 + lVar12 + 0x13f0);
          fVar91 = *(float *)(bezier_basis0 + lVar12 + 0x13f4);
          fVar102 = *(float *)(bezier_basis0 + lVar12 + 0x13f8);
          lVar12 = lVar10 * 4;
          fVar93 = *(float *)(bezier_basis0 + lVar12 + 0x1cf4);
          fVar100 = *(float *)(bezier_basis0 + lVar12 + 0x1cf8);
          fVar101 = *(float *)(bezier_basis0 + lVar12 + 0x1cfc);
          fVar115 = *(float *)(bezier_basis0 + lVar12 + 0x1d00);
          lVar12 = lVar10 * 4;
          fVar103 = *(float *)(bezier_basis0 + lVar12 + 0x2178);
          fVar113 = *(float *)(bezier_basis0 + lVar12 + 0x217c);
          fVar114 = *(float *)(bezier_basis0 + lVar12 + 0x2180);
          fVar130 = *(float *)(bezier_basis0 + lVar12 + 0x2184);
          lVar10 = lVar10 * 4;
          fVar48 = *(float *)(bezier_basis0 + lVar10 + 0x1870);
          fVar74 = *(float *)(bezier_basis0 + lVar10 + 0x1874);
          fVar116 = *(float *)(bezier_basis0 + lVar10 + 0x1878);
          fVar127 = *(float *)(bezier_basis0 + lVar10 + 0x187c);
          fVar129 = fVar194 * fVar75 + fVar177 * fVar48 + fVar104 * fVar93 + fVar139 * fVar103;
          fVar137 = fVar194 * fVar90 + fVar177 * fVar74 + fVar104 * fVar100 + fVar139 * fVar113;
          fVar138 = fVar194 * fVar91 + fVar177 * fVar116 + fVar104 * fVar101 + fVar139 * fVar114;
          fVar140 = fVar194 * fVar102 + fVar177 * fVar127 + fVar104 * fVar115 + fVar139 * fVar130;
          fVar158 = fVar197 * fVar75 + fVar178 * fVar48 + fVar179 * fVar93 + fVar191 * fVar103;
          fVar146 = fVar197 * fVar90 + fVar178 * fVar74 + fVar179 * fVar100 + fVar191 * fVar113;
          fVar148 = fVar197 * fVar91 + fVar178 * fVar116 + fVar179 * fVar101 + fVar191 * fVar114;
          fVar190 = fVar197 * fVar102 + fVar178 * fVar127 + fVar179 * fVar115 + fVar191 * fVar130;
          fVar75 = fVar75 * fVar153 + fVar48 * fVar92 + fVar93 * fVar172 + fVar103 * fVar145;
          fVar90 = fVar90 * fVar153 + fVar74 * fVar92 + fVar100 * fVar172 + fVar113 * fVar145;
          fVar91 = fVar91 * fVar153 + fVar116 * fVar92 + fVar101 * fVar172 + fVar114 * fVar145;
          fVar102 = fVar102 * fVar153 + fVar127 * fVar92 + fVar115 * fVar172 + fVar130 * fVar145;
          uVar202 = -(uint)(iVar15 == 0);
          uVar205 = -(uint)(iVar15 == 1);
          uVar206 = -(uint)(iVar15 == 2);
          uVar207 = -(uint)(iVar15 == 3);
          uVar150 = -(uint)(iVar15 == 7);
          uVar154 = -(uint)(iVar15 == 6);
          uVar156 = -(uint)(iVar15 == 5);
          uVar157 = -(uint)(iVar15 == 4);
          auVar136._0_4_ = (float)(~uVar150 & (uint)fVar129) * 0.055555556 + auVar170._0_4_;
          auVar136._4_4_ = (float)(~uVar154 & (uint)fVar137) * 0.055555556 + auVar170._4_4_;
          auVar136._8_4_ = (float)(~uVar156 & (uint)fVar138) * 0.055555556 + auVar170._8_4_;
          auVar136._12_4_ = (float)(~uVar157 & (uint)fVar140) * 0.055555556 + auVar170._12_4_;
          auVar141 = minps(auVar141,auVar170);
          auVar159 = maxps(auVar159,auVar170);
          auVar171._0_8_ =
               CONCAT44(auVar170._4_4_ - (float)(~uVar205 & (uint)fVar137) * 0.055555556,
                        auVar170._0_4_ - (float)(~uVar202 & (uint)fVar129) * 0.055555556);
          auVar171._8_4_ = auVar170._8_4_ - (float)(~uVar206 & (uint)fVar138) * 0.055555556;
          auVar171._12_4_ = auVar170._12_4_ - (float)(~uVar207 & (uint)fVar140) * 0.055555556;
          auVar110._0_4_ = (float)(~uVar150 & (uint)fVar158) * 0.055555556 + auVar64._0_4_;
          auVar110._4_4_ = (float)(~uVar154 & (uint)fVar146) * 0.055555556 + auVar64._4_4_;
          auVar110._8_4_ = (float)(~uVar156 & (uint)fVar148) * 0.055555556 + auVar64._8_4_;
          auVar110._12_4_ = (float)(~uVar157 & (uint)fVar190) * 0.055555556 + auVar64._12_4_;
          auVar49 = minps(auVar49,auVar64);
          auVar133 = maxps(auVar133,auVar64);
          auVar65._0_8_ =
               CONCAT44(auVar64._4_4_ - (float)(~uVar205 & (uint)fVar146) * 0.055555556,
                        auVar64._0_4_ - (float)(~uVar202 & (uint)fVar158) * 0.055555556);
          auVar65._8_4_ = auVar64._8_4_ - (float)(~uVar206 & (uint)fVar148) * 0.055555556;
          auVar65._12_4_ = auVar64._12_4_ - (float)(~uVar207 & (uint)fVar190) * 0.055555556;
          auVar163._0_4_ = (float)(~uVar150 & (uint)fVar75) * 0.055555556 + auVar182._0_4_;
          auVar163._4_4_ = (float)(~uVar154 & (uint)fVar90) * 0.055555556 + auVar182._4_4_;
          auVar163._8_4_ = (float)(~uVar156 & (uint)fVar91) * 0.055555556 + auVar182._8_4_;
          auVar163._12_4_ = (float)(~uVar157 & (uint)fVar102) * 0.055555556 + auVar182._12_4_;
          auVar50 = minps(auVar50,auVar182);
          auVar143 = maxps(auVar22,auVar182);
          auVar183._0_8_ =
               CONCAT44(auVar182._4_4_ - (float)(~uVar205 & (uint)fVar90) * 0.055555556,
                        auVar182._0_4_ - (float)(~uVar202 & (uint)fVar75) * 0.055555556);
          auVar183._8_4_ = auVar182._8_4_ - (float)(~uVar206 & (uint)fVar91) * 0.055555556;
          auVar183._12_4_ = auVar182._12_4_ - (float)(~uVar207 & (uint)fVar102) * 0.055555556;
          auVar123._8_4_ = auVar171._8_4_;
          auVar123._0_8_ = auVar171._0_8_;
          auVar123._12_4_ = auVar171._12_4_;
          auVar22 = minps(auVar123,auVar136);
          auVar141 = minps(auVar141,auVar22);
          auVar124._8_4_ = auVar65._8_4_;
          auVar124._0_8_ = auVar65._0_8_;
          auVar124._12_4_ = auVar65._12_4_;
          auVar22 = minps(auVar124,auVar110);
          auVar49 = minps(auVar49,auVar22);
          auVar125._8_4_ = auVar183._8_4_;
          auVar125._0_8_ = auVar183._0_8_;
          auVar125._12_4_ = auVar183._12_4_;
          auVar22 = minps(auVar125,auVar163);
          auVar50 = minps(auVar50,auVar22);
          auVar22 = maxps(auVar171,auVar136);
          auVar159 = maxps(auVar159,auVar22);
          auVar22 = maxps(auVar65,auVar110);
          auVar133 = maxps(auVar133,auVar22);
          auVar22 = maxps(auVar183,auVar163);
          auVar22 = maxps(auVar143,auVar22);
          lVar10 = 4;
          bVar21 = false;
        } while (bVar13);
        auVar118 = minps(auVar38,auVar118);
        auVar111._8_4_ = auVar118._0_4_;
        auVar111._12_4_ = 0;
        auVar118 = maxps(auVar42,auVar134);
        auVar126._8_4_ = auVar118._0_4_;
        auVar126._12_4_ = 0;
        auVar66._4_4_ = auVar141._0_4_;
        auVar66._0_4_ = auVar141._4_4_;
        auVar66._8_4_ = auVar141._12_4_;
        auVar66._12_4_ = auVar141._8_4_;
        auVar141 = minps(auVar66,auVar141);
        auVar98._0_8_ = auVar141._8_8_;
        auVar98._8_4_ = auVar141._0_4_;
        auVar98._12_4_ = auVar141._4_4_;
        auVar118 = minps(auVar98,auVar141);
        auVar67._4_4_ = auVar49._0_4_;
        auVar67._0_4_ = auVar49._4_4_;
        auVar67._8_4_ = auVar49._12_4_;
        auVar67._12_4_ = auVar49._8_4_;
        auVar49 = minps(auVar67,auVar49);
        auVar86._0_8_ = auVar49._8_8_;
        auVar86._8_4_ = auVar49._0_4_;
        auVar86._12_4_ = auVar49._4_4_;
        auVar141 = minps(auVar86,auVar49);
        auVar68._4_4_ = auVar50._0_4_;
        auVar68._0_4_ = auVar50._4_4_;
        auVar68._8_4_ = auVar50._12_4_;
        auVar68._12_4_ = auVar50._8_4_;
        auVar49 = minps(auVar68,auVar50);
        auVar99._0_8_ = auVar49._8_8_;
        auVar99._8_4_ = auVar49._0_4_;
        auVar99._12_4_ = auVar49._4_4_;
        auVar49 = minps(auVar99,auVar49);
        auVar87._4_4_ = auVar141._0_4_;
        auVar87._0_4_ = auVar118._0_4_;
        auVar87._8_4_ = auVar49._0_4_;
        auVar87._12_4_ = 0;
        auVar118 = minps(auVar111,auVar87);
        auVar69._4_4_ = auVar159._0_4_;
        auVar69._0_4_ = auVar159._4_4_;
        auVar69._8_4_ = auVar159._12_4_;
        auVar69._12_4_ = auVar159._8_4_;
        auVar49 = maxps(auVar69,auVar159);
        auVar88._0_8_ = auVar49._8_8_;
        auVar88._8_4_ = auVar49._0_4_;
        auVar88._12_4_ = auVar49._4_4_;
        auVar50 = maxps(auVar88,auVar49);
        auVar70._4_4_ = auVar133._0_4_;
        auVar70._0_4_ = auVar133._4_4_;
        auVar70._8_4_ = auVar133._12_4_;
        auVar70._12_4_ = auVar133._8_4_;
        auVar49 = maxps(auVar70,auVar133);
        auVar43._0_8_ = auVar49._8_8_;
        auVar43._8_4_ = auVar49._0_4_;
        auVar43._12_4_ = auVar49._4_4_;
        auVar49 = maxps(auVar43,auVar49);
        auVar71._4_4_ = auVar22._0_4_;
        auVar71._0_4_ = auVar22._4_4_;
        auVar71._8_4_ = auVar22._12_4_;
        auVar71._12_4_ = auVar22._8_4_;
        auVar141 = maxps(auVar71,auVar22);
        auVar89._0_8_ = auVar141._8_8_;
        auVar89._8_4_ = auVar141._0_4_;
        auVar89._12_4_ = auVar141._4_4_;
        auVar141 = maxps(auVar89,auVar141);
        auVar44._4_4_ = auVar49._0_4_;
        auVar44._0_4_ = auVar50._0_4_;
        auVar44._8_4_ = auVar141._0_4_;
        auVar44._12_4_ = 0;
        auVar141 = maxps(auVar126,auVar44);
        auVar45._0_8_ = auVar118._0_8_ & 0x7fffffff7fffffff;
        auVar45._8_4_ = ABS(auVar118._8_4_);
        auVar45._12_4_ = auVar118._12_4_ & 0x7fffffff;
        auVar72._0_8_ = auVar141._0_8_ & 0x7fffffff7fffffff;
        auVar72._8_4_ = ABS(auVar141._8_4_);
        auVar72._12_4_ = auVar141._12_4_ & 0x7fffffff;
        auVar49 = maxps(auVar45,auVar72);
        fVar104 = auVar49._4_4_;
        if (auVar49._4_4_ <= auVar49._0_4_) {
          fVar104 = auVar49._0_4_;
        }
        auVar46._8_8_ = auVar49._8_8_;
        auVar46._0_8_ = auVar49._8_8_;
        if (auVar49._8_4_ <= fVar104) {
          auVar46._0_4_ = fVar104;
        }
        fVar104 = auVar46._0_4_ * 4.7683716e-07;
        aVar112._0_4_ = auVar118._0_4_ - fVar104;
        aVar112._4_4_ = auVar118._4_4_ - fVar104;
        aVar112._8_4_ = auVar118._8_4_ - fVar104;
        aVar47._0_4_ = fVar104 + auVar141._0_4_;
        aVar47._4_4_ = fVar104 + auVar141._4_4_;
        aVar47._8_4_ = fVar104 + auVar141._8_4_;
        aVar112.m128[3] = (float)geomID;
        aVar47.m128[3] = (float)uVar17;
        auVar73._0_4_ = aVar112._0_4_ + aVar47._0_4_;
        auVar73._4_4_ = aVar112._4_4_ + aVar47._4_4_;
        auVar73._8_4_ = aVar112._8_4_ + aVar47._8_4_;
        auVar73._12_4_ = (float)geomID + (float)uVar17;
        local_98 = minps(local_98,auVar73);
        local_a8 = maxps(local_a8,auVar73);
        local_c8 = minps(local_c8,(undefined1  [16])aVar112);
        prims[local_d0].lower.field_0 = aVar112;
        local_b8 = maxps(local_b8,(undefined1  [16])aVar47);
        prims[local_d0].upper.field_0 = aVar47;
        local_e0 = local_e0 + 1;
        local_d0 = local_d0 + 1;
      }
LAB_009da0b0:
      uVar17 = uVar17 + 1;
    } while (uVar17 < r->_end);
  }
  else {
    local_e0 = 0;
    local_a8._8_8_ = 0xff800000ff800000;
    local_a8._0_8_ = 0xff800000ff800000;
    local_b8._8_8_ = 0xff800000ff800000;
    local_b8._0_8_ = 0xff800000ff800000;
    local_98._8_8_ = 0x7f8000007f800000;
    local_98._0_8_ = 0x7f8000007f800000;
    local_c8._8_8_ = 0x7f8000007f800000;
    local_c8._0_8_ = 0x7f8000007f800000;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_c8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = local_c8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = local_b8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = local_b8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_98._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_98._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_a8._8_8_;
  __return_storage_ptr__->end = local_e0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }